

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact.hpp
# Opt level: O0

basic_variable<std::allocator<char>_> * __thiscall
trial::protocol::json::detail::compact<trial::dynamic::basic_variable<std::allocator<char>>>
          (basic_variable<std::allocator<char>_> *__return_storage_ptr__,detail *this,intmax_t value
          )

{
  char cVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  intmax_t value_local;
  
  cVar1 = std::numeric_limits<signed_char>::max();
  if (((long)this <= (long)cVar1) &&
     (cVar1 = std::numeric_limits<signed_char>::min(), (long)cVar1 <= (long)this)) {
    dynamic::basic_variable<std::allocator<char>_>::basic_variable<signed_char>
              (__return_storage_ptr__,(char)this);
    return __return_storage_ptr__;
  }
  sVar2 = std::numeric_limits<short>::max();
  if (((long)this <= (long)sVar2) &&
     (sVar2 = std::numeric_limits<short>::min(), (long)sVar2 <= (long)this)) {
    dynamic::basic_variable<std::allocator<char>_>::basic_variable<short>
              (__return_storage_ptr__,(short)this);
    return __return_storage_ptr__;
  }
  iVar3 = std::numeric_limits<int>::max();
  if (((long)this <= (long)iVar3) &&
     (iVar3 = std::numeric_limits<int>::min(), (long)iVar3 <= (long)this)) {
    dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
              (__return_storage_ptr__,(int)this);
    return __return_storage_ptr__;
  }
  lVar4 = std::numeric_limits<long>::max();
  if (((long)this <= lVar4) && (lVar4 = std::numeric_limits<long>::min(), lVar4 <= (long)this)) {
    dynamic::basic_variable<std::allocator<char>_>::basic_variable<long>
              (__return_storage_ptr__,(long)this);
    return __return_storage_ptr__;
  }
  dynamic::basic_variable<std::allocator<char>_>::basic_variable<long>
            (__return_storage_ptr__,(long)this);
  return __return_storage_ptr__;
}

Assistant:

auto compact(std::intmax_t value) -> ReturnType
{
    if ((value <= std::numeric_limits<signed char>::max()) &&
        (value >= std::numeric_limits<signed char>::min()))
        return static_cast<signed char>(value);
    if ((value <= std::numeric_limits<signed short int>::max()) &&
        (value >= std::numeric_limits<signed short int>::min()))
        return static_cast<signed short int>(value);
    if ((value <= std::numeric_limits<signed int>::max()) &&
        (value >= std::numeric_limits<signed int>::min()))
        return static_cast<signed int>(value);
    if ((value <= std::numeric_limits<signed long int>::max()) &&
        (value >= std::numeric_limits<signed long int>::min()))
        return static_cast<signed long int>(value);
    return value;
}